

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O0

void prvTidyCheckHTMLTagsAttribsVersions(TidyDocImpl *doc,Node *node)

{
  AttVal *pAVar1;
  uint code;
  uint code_00;
  int iVar2;
  Bool BVar3;
  bool bVar4;
  Bool local_58;
  uint local_54;
  Bool htmlIs5;
  Bool tagLooksCustom;
  Bool attrIsMismatched;
  Bool attrIsProprietary;
  AttVal *attval;
  AttVal *next_attr;
  Bool check_versions;
  int attrReportType;
  int tagReportType;
  uint version;
  uint declared;
  uint versionEmitted;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  local_54 = doc->lexer->versionEmitted;
  if (local_54 == 0) {
    local_54 = doc->lexer->doctype;
  }
  code = 0x23a;
  if ((local_54 & 0x60124) != 0) {
    code = 0x239;
  }
  code_00 = 0x255;
  if ((local_54 & 0x60124) != 0) {
    code_00 = 0x254;
  }
  iVar2 = (int)(doc->config).value[0x51].v;
  bVar4 = (doc->lexer->doctype & 0x60000) != 0;
  for (_declared = node; _declared != (Node *)0x0; _declared = _declared->next) {
    BVar3 = prvTidynodeIsElement(_declared);
    if (((BVar3 != no) && (_declared->tag != (Dict *)0x0)) &&
       ((int)(doc->config).value[0x67].v == 0)) {
      if ((iVar2 == 0) || ((_declared->tag->versions & local_54) != 0)) {
        if (((_declared->tag->versions & 0xe000) != 0) &&
           (((int)(doc->config).value[0x30].v == 0 ||
            ((((_declared == (Node *)0x0 || (_declared->tag == (Dict *)0x0)) ||
              (_declared->tag->id != TidyTag_NOBR)) &&
             (((_declared == (Node *)0x0 || (_declared->tag == (Dict *)0x0)) ||
              (_declared->tag->id != TidyTag_WBR)))))))) {
          BVar3 = prvTidynodeIsAutonomousCustomFormat(_declared);
          if (((bVar4) && (BVar3 == no)) || (!bVar4)) {
            prvTidyReport(doc,(Node *)0x0,_declared,0x270);
          }
          if (((_declared == (Node *)0x0) || (_declared->tag == (Dict *)0x0)) ||
             (_declared->tag->id != TidyTag_LAYER)) {
            if (((_declared == (Node *)0x0) || (_declared->tag == (Dict *)0x0)) ||
               (_declared->tag->id != TidyTag_SPACER)) {
              if (((_declared != (Node *)0x0) && (_declared->tag != (Dict *)0x0)) &&
                 (_declared->tag->id == TidyTag_NOBR)) {
                doc->badLayout = doc->badLayout | 4;
              }
            }
            else {
              doc->badLayout = doc->badLayout | 1;
            }
          }
          else {
            doc->badLayout = doc->badLayout | 2;
          }
        }
      }
      else {
        prvTidyReport(doc,(Node *)0x0,_declared,code);
      }
    }
    BVar3 = prvTidynodeIsElement(_declared);
    if (BVar3 != no) {
      pAVar1 = _declared->attributes;
      while (_attrIsMismatched = pAVar1, _attrIsMismatched != (AttVal *)0x0) {
        pAVar1 = _attrIsMismatched->next;
        BVar3 = prvTidyAttributeIsProprietary(_declared,_attrIsMismatched);
        if (iVar2 == 0) {
          local_58 = no;
        }
        else {
          local_58 = prvTidyAttributeIsMismatched(_declared,_attrIsMismatched,doc);
        }
        if (BVar3 == no) {
          if (local_58 != no) {
            prvTidyReportAttrError(doc,_declared,_attrIsMismatched,code_00);
          }
        }
        else if ((int)(doc->config).value[0x58].v != 0) {
          prvTidyReportAttrError(doc,_declared,_attrIsMismatched,0x26f);
        }
        if (((BVar3 != no) || (local_58 != no)) && ((int)(doc->config).value[0x11].v != 0)) {
          prvTidyRemoveAttribute(doc,_declared,_attrIsMismatched);
        }
      }
    }
    if (_declared->content != (Node *)0x0) {
      prvTidyCheckHTMLTagsAttribsVersions(doc,_declared->content);
    }
  }
  return;
}

Assistant:

void TY_(CheckHTMLTagsAttribsVersions)( TidyDocImpl* doc, Node* node )
{
    uint versionEmitted = doc->lexer->versionEmitted;
    uint declared = doc->lexer->doctype;
    uint version = versionEmitted == 0 ? declared : versionEmitted;
    int tagReportType = VERS_STRICT & version ? ELEMENT_VERS_MISMATCH_ERROR : ELEMENT_VERS_MISMATCH_WARN;
    int attrReportType = VERS_STRICT & version ? MISMATCHED_ATTRIBUTE_ERROR : MISMATCHED_ATTRIBUTE_WARN;
    Bool check_versions = cfgBool( doc, TidyStrictTagsAttr );
    AttVal *next_attr, *attval;
    Bool attrIsProprietary = no;
    Bool attrIsMismatched = yes;
    Bool tagLooksCustom = no;
    Bool htmlIs5 = (doc->lexer->doctype & VERS_HTML5) > 0;

    while (node)
    {
        /* This bit here handles our HTML tags */
        if ( TY_(nodeIsElement)(node) && node->tag ) {

            /* Leave XML stuff alone. */
            if ( !cfgBool(doc, TidyXmlTags) )
            {
                /* Version mismatches take priority. */
                if ( check_versions && !(node->tag->versions & version) )
                {
                    TY_(Report)(doc, NULL, node, tagReportType );
                }
                /* If it's not mismatched, it could still be proprietary. */
                else if ( node->tag->versions & VERS_PROPRIETARY )
                {
                    if ( !cfgBool(doc, TidyMakeClean) ||
                        ( !nodeIsNOBR(node) && !nodeIsWBR(node) ) )
                    {
                        /* It looks custom, despite whether it's a known tag. */
                        tagLooksCustom = TY_(nodeIsAutonomousCustomFormat)( node );

                        /* If we're in HTML5 mode and the tag does not look
                           like a valid custom tag, then issue a warning.
                           Appearance is good enough because invalid tags have
                           been dropped. Also, if we're not in HTML5 mode, then
                           then everything that reaches here gets the warning.
                           Everything else can be ignored. */

                        if ( (htmlIs5 && !tagLooksCustom) || !htmlIs5 )
                        {
                            TY_(Report)(doc, NULL, node, PROPRIETARY_ELEMENT );
                        }

                        if ( nodeIsLAYER(node) )
                            doc->badLayout |= USING_LAYER;
                        else if ( nodeIsSPACER(node) )
                            doc->badLayout |= USING_SPACER;
                        else if ( nodeIsNOBR(node) )
                            doc->badLayout |= USING_NOBR;
                    }
                }
            }
        }

        /* And this bit here handles our attributes */
        if (TY_(nodeIsElement)(node))
        {
            attval = node->attributes;

            while (attval)
            {
                next_attr = attval->next;

                attrIsProprietary = TY_(AttributeIsProprietary)(node, attval);
                attrIsMismatched = check_versions ? TY_(AttributeIsMismatched)(node, attval, doc) : no;
                /* Let the PROPRIETARY_ATTRIBUTE warning have precedence. */
                if ( attrIsProprietary )
                {
                    if ( cfgBool(doc, TidyWarnPropAttrs) )
                        TY_(ReportAttrError)(doc, node, attval, PROPRIETARY_ATTRIBUTE);
                }
                else if ( attrIsMismatched )
                {
                    TY_(ReportAttrError)(doc, node, attval, attrReportType);
                }

                /* @todo: do we need a new option to drop mismatches? Or should we
                 simply drop them? */
                if ( ( attrIsProprietary || attrIsMismatched ) && cfgBool(doc, TidyDropPropAttrs) )
                    TY_(RemoveAttribute)( doc, node, attval );

                attval = next_attr;
            }
        }

        if (node->content)
            TY_(CheckHTMLTagsAttribsVersions)( doc, node->content );
        
        node = node->next;
    }
}